

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O3

void __thiscall C3DFile::fillPointLabelMap(C3DFile *this)

{
  byte bVar1;
  void *__dest;
  mapped_type *pmVar2;
  ulong uVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  string label;
  string row;
  ParameterInfo param_info;
  key_type local_f0;
  ParameterInfo local_d0;
  ParameterInfo local_80;
  
  local_80.name_length = -1;
  local_80.group_id = -1;
  local_80.name = (char *)0x0;
  local_80.next_offset = -1;
  local_80.data_type = -1;
  local_80.n_dimensions = 0xff;
  local_80.dimensions = (byte *)0x0;
  local_80.char_data = (char *)0x0;
  local_80.int_data = (Sint16 *)0x0;
  local_80.float_data = (float *)0x0;
  local_80.descr_length = -1;
  local_80.description = (char *)0x0;
  local_80.locked = false;
  getParamInfo(&local_d0,this,"POINT:LABELS");
  ParameterInfo::operator=(&local_80,&local_d0);
  ParameterInfo::~ParameterInfo(&local_d0);
  if (local_80.data_type != -1) {
    __assert_fail("param_info.data_type == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x17e,"void C3DFile::fillPointLabelMap()");
  }
  if (local_80.n_dimensions == '\x02') {
    uVar6 = (ulong)local_80.dimensions[1];
    bVar1 = *local_80.dimensions;
    uVar5 = bVar1 * uVar6;
    __dest = operator_new__(uVar5);
    memcpy(__dest,local_80.char_data,uVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->point_label,
                      (this->point_label).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    if (uVar6 != 0) {
      uVar5 = 0;
      do {
        local_d0._0_8_ = (long)&local_d0 + 0x10;
        local_d0.name = (char *)0x0;
        local_d0.next_offset._0_1_ = 0;
        cVar4 = (char)&local_d0;
        if (bVar1 != 0) {
          uVar3 = 0;
          do {
            std::__cxx11::string::push_back(cVar4);
            uVar3 = uVar3 + 1;
          } while (bVar1 != uVar3);
        }
        std::__cxx11::string::find_last_not_of(cVar4,0x20);
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_d0);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                 ::operator[](&this->label_point_map,&local_f0);
        *pmVar2 = (mapped_type)uVar5;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->point_label,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((void *)local_d0._0_8_ != (void *)((long)&local_d0 + 0x10U)) {
          operator_delete((void *)local_d0._0_8_,
                          CONCAT71(local_d0._17_7_,(undefined1)local_d0.next_offset) + 1);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar6);
    }
    operator_delete__(__dest);
    ParameterInfo::~ParameterInfo(&local_80);
    return;
  }
  __assert_fail("param_info.n_dimensions == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x17f,"void C3DFile::fillPointLabelMap()");
}

Assistant:

void C3DFile::fillPointLabelMap () {
	ParameterInfo param_info;
	param_info = getParamInfo ("POINT:LABELS");

	assert (param_info.data_type == -1);
	assert (param_info.n_dimensions == 2);

	// Warning: as column major is used, we have to switch row and column numbers!
	DataMatrix<char> data_matrix(
			static_cast<unsigned int>(param_info.dimensions[1]),
			static_cast<unsigned int>(param_info.dimensions[0])
			);

	data_matrix.CopyFrom(param_info.char_data);

  point_label.clear();

	size_t i,j;
	for (i = 0; i < data_matrix.GetRows(); i++) {
		std::string row;
		for (j = 0; j < data_matrix.GetColumns(); j++) {
			row += data_matrix(i,j);
		}
		std::string label = row.substr(0, row.find_last_not_of(' ') + 1);

    label_point_map[label] = i;
    point_label.push_back(label);
	}
}